

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O2

void __thiscall dgMatrix::EigenVectors(dgMatrix *this,dgVector *eigenValues,dgMatrix *initialGuess)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  bool bVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  HaF32 z;
  dgTemplateVector<float> *pdVar13;
  float *pfVar14;
  ulong uVar15;
  dgVector *pdVar16;
  HaI32 i;
  ulong uVar17;
  HaI32 i_00;
  ulong uVar18;
  HaI32 j;
  int i_01;
  undefined1 auVar21 [16];
  float fVar19;
  float fVar20;
  dgMatrix dVar22;
  undefined1 auVar28 [48];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [56];
  undefined1 auVar33 [64];
  undefined1 auVar32 [16];
  dgMatrix dVar34;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [56];
  undefined1 auVar42 [64];
  undefined1 auVar44 [16];
  dgTemplateVector<float> dVar45;
  undefined8 local_198;
  HaF32 local_190;
  undefined1 local_188 [16];
  float local_178 [4];
  dgTemplateVector<float> local_168;
  undefined1 local_158 [16];
  dgVector *local_148;
  ulong local_140;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  ulong local_128;
  ulong local_120;
  dgMatrix eigenVectors;
  undefined1 local_c0 [64];
  dgTemplateVector<float> local_80;
  dgVector tmp;
  undefined1 auVar26 [64];
  undefined1 auVar23 [64];
  
  local_148 = eigenValues;
  Transpose4X4(&eigenVectors,initialGuess);
  operator*((dgMatrix *)&tmp,initialGuess,this);
  operator*((dgMatrix *)local_c0,(dgMatrix *)&tmp,&eigenVectors);
  auVar28 = local_c0._16_48_;
  dVar22.m_front.super_dgTemplateVector<float>.m_z = (float)local_c0._8_4_;
  dVar22.m_front.super_dgTemplateVector<float>.m_w = (float)local_c0._12_4_;
  dVar22.m_front.super_dgTemplateVector<float>.m_x = (float)local_c0._0_4_;
  dVar22.m_front.super_dgTemplateVector<float>.m_y = (float)local_c0._4_4_;
  dVar22.m_up.super_dgTemplateVector<float>.m_x = (float)local_c0._16_4_;
  dVar22.m_up.super_dgTemplateVector<float>.m_y = (float)local_c0._20_4_;
  dVar22.m_up.super_dgTemplateVector<float>.m_z = (float)local_c0._24_4_;
  dVar22.m_up.super_dgTemplateVector<float>.m_w = (float)local_c0._28_4_;
  dVar22.m_right.super_dgTemplateVector<float>.m_x = (float)local_c0._32_4_;
  dVar22.m_right.super_dgTemplateVector<float>.m_y = (float)local_c0._36_4_;
  dVar22.m_right.super_dgTemplateVector<float>.m_z = (float)local_c0._40_4_;
  dVar22.m_right.super_dgTemplateVector<float>.m_w = (float)local_c0._44_4_;
  dVar22.m_posit.super_dgTemplateVector<float>.m_x = (float)local_c0._48_4_;
  dVar22.m_posit.super_dgTemplateVector<float>.m_y = (float)local_c0._52_4_;
  dVar22.m_posit.super_dgTemplateVector<float>.m_z = (float)local_c0._56_4_;
  dVar22.m_posit.super_dgTemplateVector<float>.m_w = (float)local_c0._60_4_;
  uVar15 = 0;
  *this = dVar22;
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_x;
  fVar2 = (this->m_up).super_dgTemplateVector<float>.m_y;
  local_190 = (HaF32)(this->m_right).super_dgTemplateVector<float>.m_z;
  _local_138 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
  local_198 = CONCAT44(fVar2,fVar1);
  local_c0._16_48_ = auVar28;
  do {
    z = local_190;
    local_178[2] = 0.0;
    local_178[0] = 0.0;
    local_178[1] = 0.0;
    if ((uint)uVar15 == 0x32) {
      auVar21 = vmovshdup_avx(_local_138);
      dgVector::dgVector((dgVector *)local_c0,local_138._0_4_,auVar21._0_4_,local_190,0.0);
      (local_148->super_dgTemplateVector<float>).m_x = (float)local_c0._0_4_;
      (local_148->super_dgTemplateVector<float>).m_y = (float)local_c0._4_4_;
      (local_148->super_dgTemplateVector<float>).m_z = (float)local_c0._8_4_;
      (local_148->super_dgTemplateVector<float>).m_w = (float)local_c0._12_4_;
      dVar34 = identityMatrix;
LAB_00d9fb4b:
      *this = dVar34;
      return;
    }
    uVar17._0_4_ = (this->m_front).super_dgTemplateVector<float>.m_y;
    uVar17._4_4_ = (this->m_front).super_dgTemplateVector<float>.m_z;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar17;
    auVar36._0_8_ = uVar17 ^ 0x8000000080000000;
    auVar36._8_4_ = 0x80000000;
    auVar36._12_4_ = 0x80000000;
    uVar18 = vcmpps_avx512vl(auVar36,auVar29,2);
    auVar23._16_48_ = dVar22._16_48_;
    bVar4 = (bool)((byte)uVar18 & 1);
    auVar21._0_4_ = (uint)bVar4 * (undefined4)uVar17 | (uint)!bVar4 * (int)auVar36._0_8_;
    bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar4 * uVar17._4_4_ | (uint)!bVar4 * (int)(auVar36._0_8_ >> 0x20);
    auVar21._8_4_ = (uint)!(bool)((byte)(uVar18 >> 2) & 1) * -0x80000000;
    auVar21._12_4_ = (uint)!(bool)((byte)(uVar18 >> 3) & 1) * -0x80000000;
    auVar21 = vhaddps_avx(auVar21,auVar21);
    fVar1 = (this->m_up).super_dgTemplateVector<float>.m_z;
    auVar44._0_4_ = -fVar1;
    auVar44._4_4_ = 0x80000000;
    auVar44._8_4_ = 0x80000000;
    auVar44._12_4_ = 0x80000000;
    uVar5 = vcmpss_avx512f(auVar44,ZEXT416((uint)fVar1),2);
    bVar4 = (bool)((byte)uVar5 & 1);
    fVar1 = auVar21._0_4_ + (float)((uint)bVar4 * (int)fVar1 + (uint)!bVar4 * (int)auVar44._0_4_);
    if (fVar1 < 1e-06) {
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(eigenVectors.m_front.super_dgTemplateVector<float>.
                                               m_y * eigenVectors.m_front.
                                                     super_dgTemplateVector<float>.m_y)),
                                ZEXT416((uint)eigenVectors.m_front.super_dgTemplateVector<float>.m_x
                                       ),ZEXT416((uint)eigenVectors.m_front.
                                                       super_dgTemplateVector<float>.m_x));
      auVar21 = vfmadd213ss_fma(ZEXT416((uint)eigenVectors.m_front.super_dgTemplateVector<float>.m_z
                                       ),ZEXT416((uint)eigenVectors.m_front.
                                                       super_dgTemplateVector<float>.m_z),auVar21);
      fVar1 = auVar21._0_4_ + -1.0;
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar21 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar10);
      uVar5 = vcmpss_avx512f(auVar21,ZEXT416((uint)fVar1),2);
      bVar4 = (bool)((byte)uVar5 & 1);
      if (1e-05 <= (float)((uint)bVar4 * (int)fVar1 + (uint)!bVar4 * auVar21._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_front % eigenVectors.m_front) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1ef,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(eigenVectors.m_up.super_dgTemplateVector<float>.m_y *
                                              eigenVectors.m_up.super_dgTemplateVector<float>.m_y)),
                                ZEXT416((uint)eigenVectors.m_up.super_dgTemplateVector<float>.m_x),
                                ZEXT416((uint)eigenVectors.m_up.super_dgTemplateVector<float>.m_x));
      auVar21 = vfmadd213ss_fma(ZEXT416((uint)eigenVectors.m_up.super_dgTemplateVector<float>.m_z),
                                ZEXT416((uint)eigenVectors.m_up.super_dgTemplateVector<float>.m_z),
                                auVar21);
      fVar1 = auVar21._0_4_ + -1.0;
      auVar11._8_4_ = 0x80000000;
      auVar11._0_8_ = 0x8000000080000000;
      auVar11._12_4_ = 0x80000000;
      auVar21 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar11);
      uVar5 = vcmpss_avx512f(auVar21,ZEXT416((uint)fVar1),2);
      bVar4 = (bool)((byte)uVar5 & 1);
      if (1e-05 <= (float)((uint)bVar4 * (int)fVar1 + (uint)!bVar4 * auVar21._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_up % eigenVectors.m_up) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1f0,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(eigenVectors.m_right.super_dgTemplateVector<float>.
                                               m_y * eigenVectors.m_right.
                                                     super_dgTemplateVector<float>.m_y)),
                                ZEXT416((uint)eigenVectors.m_right.super_dgTemplateVector<float>.m_x
                                       ),ZEXT416((uint)eigenVectors.m_right.
                                                       super_dgTemplateVector<float>.m_x));
      auVar21 = vfmadd213ss_fma(ZEXT416((uint)eigenVectors.m_right.super_dgTemplateVector<float>.m_z
                                       ),ZEXT416((uint)eigenVectors.m_right.
                                                       super_dgTemplateVector<float>.m_z),auVar21);
      fVar1 = auVar21._0_4_ + -1.0;
      auVar12._8_4_ = 0x80000000;
      auVar12._0_8_ = 0x8000000080000000;
      auVar12._12_4_ = 0x80000000;
      auVar21 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar12);
      uVar5 = vcmpss_avx512f(auVar21,ZEXT416((uint)fVar1),2);
      bVar4 = (bool)((byte)uVar5 & 1);
      if (1e-05 <= (float)((uint)bVar4 * (int)fVar1 + (uint)!bVar4 * auVar21._0_4_)) {
        __assert_fail("dgAbsf((eigenVectors.m_right % eigenVectors.m_right) - hacd::HaF32(1.0f)) < hacd::HaF32 (1.0e-5f)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                      ,0x1f1,"void dgMatrix::EigenVectors(dgVector &, const dgMatrix &)");
      }
      auVar35 = ZEXT856(0);
      auVar43 = (undefined1  [56])0x0;
      dVar45 = dgTemplateVector<float>::operator*
                         ((dgTemplateVector<float> *)&eigenVectors,
                          &eigenVectors.m_up.super_dgTemplateVector<float>);
      auVar42._0_8_ = dVar45._8_8_;
      auVar42._8_56_ = auVar43;
      auVar33._0_8_ = dVar45._0_8_;
      auVar33._8_56_ = auVar35;
      auVar21 = vmovlhps_avx(auVar33._0_16_,auVar42._0_16_);
      local_c0._0_8_ = auVar21._0_8_;
      local_c0._8_8_ = auVar21._8_8_;
      dgVector::dgVector(&tmp,(dgTemplateVector<float> *)local_c0);
      auVar31._8_8_ = 0;
      auVar31._0_4_ = eigenVectors.m_right.super_dgTemplateVector<float>.m_x;
      auVar31._4_4_ = eigenVectors.m_right.super_dgTemplateVector<float>.m_y;
      auVar21 = vmovshdup_avx(auVar31);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * tmp.super_dgTemplateVector<float>.m_y
                                              )),auVar31,
                                ZEXT416((uint)tmp.super_dgTemplateVector<float>.m_x));
      auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)eigenVectors.m_right.
                                                      super_dgTemplateVector<float>.m_z),
                                ZEXT416((uint)tmp.super_dgTemplateVector<float>.m_z));
      if (auVar21._0_4_ < 0.0) {
        auVar41._0_4_ = -eigenVectors.m_right.super_dgTemplateVector<float>.m_z;
        auVar41._4_4_ = 0x80000000;
        auVar41._8_4_ = 0x80000000;
        auVar41._12_4_ = 0x80000000;
        auVar21 = vinsertps_avx(auVar41,ZEXT416((uint)eigenVectors.m_right.
                                                      super_dgTemplateVector<float>.m_w),0x1c);
        auVar32._0_8_ =
             eigenVectors.m_right.super_dgTemplateVector<float>._0_8_ ^ 0x8000000080000000;
        auVar32._8_4_ = 0x80000000;
        auVar32._12_4_ = 0x80000000;
        local_80 = (dgTemplateVector<float>)vmovlhps_avx(auVar32,auVar21);
        dgVector::dgVector((dgVector *)local_c0,&local_80);
        eigenVectors.m_right.super_dgTemplateVector<float>.m_x = (float)local_c0._0_4_;
        eigenVectors.m_right.super_dgTemplateVector<float>.m_y = (float)local_c0._4_4_;
        eigenVectors.m_right.super_dgTemplateVector<float>.m_z = (float)local_c0._8_4_;
        eigenVectors.m_right.super_dgTemplateVector<float>.m_w = (float)local_c0._12_4_;
      }
      auVar21 = vmovshdup_avx(_local_138);
      dgVector::dgVector((dgVector *)local_c0,local_138._0_4_,auVar21._0_4_,z,0.0);
      (local_148->super_dgTemplateVector<float>).m_x = (float)local_c0._0_4_;
      (local_148->super_dgTemplateVector<float>).m_y = (float)local_c0._4_4_;
      (local_148->super_dgTemplateVector<float>).m_z = (float)local_c0._8_4_;
      (local_148->super_dgTemplateVector<float>).m_w = (float)local_c0._12_4_;
      Inverse((dgMatrix *)local_c0,&eigenVectors);
      dVar34.m_front.super_dgTemplateVector<float>.m_z = (float)local_c0._8_4_;
      dVar34.m_front.super_dgTemplateVector<float>.m_w = (float)local_c0._12_4_;
      dVar34.m_front.super_dgTemplateVector<float>.m_x = (float)local_c0._0_4_;
      dVar34.m_front.super_dgTemplateVector<float>.m_y = (float)local_c0._4_4_;
      dVar34.m_up.super_dgTemplateVector<float>.m_x = (float)local_c0._16_4_;
      dVar34.m_up.super_dgTemplateVector<float>.m_y = (float)local_c0._20_4_;
      dVar34.m_up.super_dgTemplateVector<float>.m_z = (float)local_c0._24_4_;
      dVar34.m_up.super_dgTemplateVector<float>.m_w = (float)local_c0._28_4_;
      dVar34.m_right.super_dgTemplateVector<float>.m_x = (float)local_c0._32_4_;
      dVar34.m_right.super_dgTemplateVector<float>.m_y = (float)local_c0._36_4_;
      dVar34.m_right.super_dgTemplateVector<float>.m_z = (float)local_c0._40_4_;
      dVar34.m_right.super_dgTemplateVector<float>.m_w = (float)local_c0._44_4_;
      dVar34.m_posit.super_dgTemplateVector<float>.m_x = (float)local_c0._48_4_;
      dVar34.m_posit.super_dgTemplateVector<float>.m_y = (float)local_c0._52_4_;
      dVar34.m_posit.super_dgTemplateVector<float>.m_z = (float)local_c0._56_4_;
      dVar34.m_posit.super_dgTemplateVector<float>.m_w = (float)local_c0._60_4_;
      goto LAB_00d9fb4b;
    }
    fVar1 = fVar1 * 0.022222223;
    auVar23._0_16_ = ZEXT416((uint)fVar1);
    fVar1 = (float)((uint)((uint)uVar15 < 3) * (int)fVar1);
    dVar22._4_60_ = auVar23._4_60_;
    dVar22.m_front.super_dgTemplateVector<float>.m_x = fVar1;
    uVar17 = 1;
    uVar18 = 0;
    local_120 = uVar15;
    while (uVar18 != 2) {
      local_140 = uVar18 + 1;
      local_128 = uVar17;
      while( true ) {
        auVar28 = dVar22._16_48_;
        if (uVar17 == 3) break;
        i_00 = (HaI32)uVar18;
        pdVar13 = &operator[](this,i_00)->super_dgTemplateVector<float>;
        i = (HaI32)uVar17;
        pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
        fVar2 = *pfVar14;
        auVar37._0_4_ = -fVar2;
        auVar37._4_4_ = 0x80000000;
        auVar37._8_4_ = 0x80000000;
        auVar37._12_4_ = 0x80000000;
        uVar5 = vcmpss_avx512f(auVar37,ZEXT416((uint)fVar2),2);
        bVar4 = (bool)((byte)uVar5 & 1);
        fVar2 = (float)((uint)bVar4 * (int)fVar2 + (uint)!bVar4 * (int)auVar37._0_4_) * 100.0;
        if ((uint)uVar15 < 4) {
LAB_00d9f411:
          local_188._0_4_ = fVar2;
          pdVar13 = &operator[](this,i_00)->super_dgTemplateVector<float>;
          pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
          fVar2 = *pfVar14;
          auVar7._8_4_ = 0x80000000;
          auVar7._0_8_ = 0x8000000080000000;
          auVar7._12_4_ = 0x80000000;
          auVar25._0_16_ = vxorps_avx512vl(ZEXT416((uint)fVar2),auVar7);
          uVar5 = vcmpss_avx512f(auVar25._0_16_,ZEXT416((uint)fVar2),2);
          bVar4 = (bool)((byte)uVar5 & 1);
          auVar25._16_48_ = auVar28;
          dVar22._4_60_ = auVar25._4_60_;
          dVar22.m_front.super_dgTemplateVector<float>.m_x =
               (float)((uint)bVar4 * (int)fVar2 + (uint)!bVar4 * auVar25._0_4_);
          if (fVar1 < dVar22.m_front.super_dgTemplateVector<float>.m_x) {
            fVar2 = *(float *)((long)&local_198 + uVar18 * 4);
            fVar19 = *(float *)((long)&local_198 + uVar17 * 4) - fVar2;
            auVar8._8_4_ = 0x80000000;
            auVar8._0_8_ = 0x8000000080000000;
            auVar8._12_4_ = 0x80000000;
            auVar21 = vxorps_avx512vl(ZEXT416((uint)fVar19),auVar8);
            uVar5 = vcmpss_avx512f(auVar21,ZEXT416((uint)fVar19),2);
            bVar4 = (bool)((byte)uVar5 & 1);
            fVar20 = (float)((uint)bVar4 * (int)fVar19 + (uint)!bVar4 * auVar21._0_4_);
            if ((fVar20 + (float)local_188._0_4_ != fVar20) ||
               (NAN(fVar20 + (float)local_188._0_4_) || NAN(fVar20))) {
              local_188._0_4_ = fVar19 * 0.5;
              pdVar13 = &operator[](this,i_00)->super_dgTemplateVector<float>;
              pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
              auVar30._0_4_ = (float)local_188._0_4_ / *pfVar14;
              auVar30._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar40._0_4_ = -auVar30._0_4_;
              auVar40._4_4_ = 0x80000000;
              auVar40._8_4_ = 0x80000000;
              auVar40._12_4_ = 0x80000000;
              uVar5 = vcmpss_avx512f(auVar40,auVar30,2);
              bVar4 = (bool)((byte)uVar5 & 1);
              uVar5 = vcmpss_avx512f(auVar30,auVar40,1);
              bVar6 = (bool)((byte)uVar5 & 1);
              auVar29 = SUB6416(ZEXT464(0x3f800000),0);
              auVar21 = vfmadd213ss_fma(auVar30,auVar30,auVar29);
              auVar21 = vsqrtss_avx(auVar21,auVar21);
              fVar19 = 1.0 / ((float)((uint)bVar4 * (int)auVar30._0_4_ +
                                     (uint)!bVar4 * (int)auVar40._0_4_) + auVar21._0_4_);
              auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar27._0_4_ = fVar19;
              auVar27._16_48_ = auVar28;
              auVar26._4_60_ = auVar27._4_60_;
              auVar26._0_4_ = (uint)bVar6 * (int)-fVar19 + (uint)!bVar6 * (int)fVar19;
              local_168 = auVar26._0_16_;
            }
            else {
              local_188 = ZEXT416((uint)fVar19);
              pdVar13 = &operator[](this,i_00)->super_dgTemplateVector<float>;
              pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
              local_168 = (dgTemplateVector<float>)
                          ZEXT416((uint)(*pfVar14 / (float)local_188._0_4_));
              auVar29 = SUB6416(ZEXT464(0x3f800000),0);
            }
            auVar21 = vfmadd213ss_fma((undefined1  [16])local_168,(undefined1  [16])local_168,
                                      auVar29);
            auVar21 = vsqrtss_avx(auVar21,auVar21);
            fVar20 = auVar29._0_4_ / auVar21._0_4_;
            fVar19 = local_168.m_x * fVar20;
            local_158 = ZEXT416((uint)fVar19);
            local_188._0_4_ = fVar19 / (fVar20 + auVar29._0_4_);
            pdVar13 = &operator[](this,i_00)->super_dgTemplateVector<float>;
            pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
            fVar19 = local_168.m_x * *pfVar14;
            local_178[uVar18] = local_178[uVar18] - fVar19;
            local_178[uVar17] = fVar19 + local_178[uVar17];
            *(float *)((long)&local_198 + uVar18 * 4) = fVar2 - fVar19;
            *(float *)((long)&local_198 + uVar17 * 4) =
                 fVar19 + *(float *)((long)&local_198 + uVar17 * 4);
            pdVar13 = &operator[](this,i_00)->super_dgTemplateVector<float>;
            pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
            *pfVar14 = 0.0;
            auVar9._8_4_ = 0x80000000;
            auVar9._0_8_ = 0x8000000080000000;
            auVar9._12_4_ = 0x80000000;
            dVar22.m_front.super_dgTemplateVector<float> =
                 (dgTemplateVector<float>)vxorps_avx512vl(local_158,auVar9);
            auVar21 = auVar28._0_16_;
            auVar29 = auVar28._16_16_;
            auVar36 = auVar28._32_16_;
            dVar22.m_up.super_dgTemplateVector<float>.m_x = (float)auVar21._0_4_;
            dVar22.m_up.super_dgTemplateVector<float>.m_y = (float)auVar21._4_4_;
            dVar22.m_up.super_dgTemplateVector<float>.m_z = (float)auVar21._8_4_;
            dVar22.m_up.super_dgTemplateVector<float>.m_w = (float)auVar21._12_4_;
            dVar22.m_right.super_dgTemplateVector<float>.m_x = (float)auVar29._0_4_;
            dVar22.m_right.super_dgTemplateVector<float>.m_y = (float)auVar29._4_4_;
            dVar22.m_right.super_dgTemplateVector<float>.m_z = (float)auVar29._8_4_;
            dVar22.m_right.super_dgTemplateVector<float>.m_w = (float)auVar29._12_4_;
            dVar22.m_posit.super_dgTemplateVector<float>.m_x = (float)auVar36._0_4_;
            dVar22.m_posit.super_dgTemplateVector<float>.m_y = (float)auVar36._4_4_;
            dVar22.m_posit.super_dgTemplateVector<float>.m_z = (float)auVar36._8_4_;
            dVar22.m_posit.super_dgTemplateVector<float>.m_w = (float)auVar36._12_4_;
            uVar15 = 0;
            local_168 = dVar22.m_front.super_dgTemplateVector<float>;
            while (uVar15 < uVar18) {
              pfVar14 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this,i_00);
              fVar2 = *pfVar14;
              pfVar14 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this,i);
              fVar19 = *pfVar14;
              auVar21 = vfmadd213ss_fma(ZEXT416((uint)local_188._0_4_),ZEXT416((uint)fVar2),
                                        ZEXT416((uint)fVar19));
              auVar21 = vfmadd132ss_fma(auVar21,ZEXT416((uint)fVar2),ZEXT416((uint)local_168.m_x));
              pfVar14 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this,i_00);
              auVar29 = vfnmadd231ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar19),
                                         ZEXT416((uint)local_188._0_4_));
              auVar29 = vfmadd132ss_fma(auVar29,ZEXT416((uint)fVar19),ZEXT416((uint)local_158._0_4_)
                                       );
              *pfVar14 = auVar21._0_4_;
              pfVar14 = dgTemplateVector<float>::operator[]((dgTemplateVector<float> *)this,i);
              *pfVar14 = auVar29._0_4_;
              uVar15 = 1;
            }
            uVar15 = local_140;
            while (uVar15 < uVar17) {
              pdVar16 = operator[](this,i_00);
              fVar2 = (pdVar16->super_dgTemplateVector<float>).m_y;
              pfVar14 = dgTemplateVector<float>::operator[]
                                  (&(this->m_up).super_dgTemplateVector<float>,i);
              fVar19 = *pfVar14;
              auVar21 = vfmadd213ss_fma(ZEXT416((uint)local_188._0_4_),ZEXT416((uint)fVar2),
                                        ZEXT416((uint)fVar19));
              auVar21 = vfmadd132ss_fma(auVar21,ZEXT416((uint)fVar2),ZEXT416((uint)local_168.m_x));
              pdVar16 = operator[](this,i_00);
              auVar29 = vfnmadd231ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar19),
                                         ZEXT416((uint)local_188._0_4_));
              auVar29 = vfmadd132ss_fma(auVar29,ZEXT416((uint)fVar19),ZEXT416((uint)local_158._0_4_)
                                       );
              (pdVar16->super_dgTemplateVector<float>).m_y = auVar21._0_4_;
              pfVar14 = dgTemplateVector<float>::operator[]
                                  (&(this->m_up).super_dgTemplateVector<float>,i);
              *pfVar14 = auVar29._0_4_;
              uVar15 = 2;
            }
            if (uVar17 != 2) {
              pdVar16 = operator[](this,i_00);
              fVar2 = (pdVar16->super_dgTemplateVector<float>).m_z;
              pdVar16 = operator[](this,i);
              fVar19 = (pdVar16->super_dgTemplateVector<float>).m_z;
              auVar21 = vfmadd213ss_fma(ZEXT416((uint)local_188._0_4_),ZEXT416((uint)fVar2),
                                        ZEXT416((uint)fVar19));
              auVar21 = vfmadd132ss_fma(auVar21,ZEXT416((uint)fVar2),ZEXT416((uint)local_168.m_x));
              pdVar16 = operator[](this,i_00);
              auVar29 = vfnmadd231ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar19),
                                         ZEXT416((uint)local_188._0_4_));
              auVar29 = vfmadd132ss_fma(auVar29,ZEXT416((uint)fVar19),ZEXT416((uint)local_158._0_4_)
                                       );
              (pdVar16->super_dgTemplateVector<float>).m_z = auVar21._0_4_;
              pdVar16 = operator[](this,i);
              (pdVar16->super_dgTemplateVector<float>).m_z = auVar29._0_4_;
            }
            for (i_01 = 0; i_01 != 3; i_01 = i_01 + 1) {
              pdVar13 = &operator[](&eigenVectors,i_01)->super_dgTemplateVector<float>;
              pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i_00);
              fVar2 = *pfVar14;
              pdVar13 = &operator[](&eigenVectors,i_01)->super_dgTemplateVector<float>;
              pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
              fVar19 = *pfVar14;
              auVar21 = vfmadd213ss_fma(ZEXT416((uint)local_188._0_4_),ZEXT416((uint)fVar2),
                                        ZEXT416((uint)fVar19));
              auVar21 = vfmadd132ss_fma(auVar21,ZEXT416((uint)fVar2),ZEXT416((uint)local_168.m_x));
              pdVar13 = &operator[](&eigenVectors,i_01)->super_dgTemplateVector<float>;
              pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i_00);
              auVar29 = vfnmadd231ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar19),
                                         ZEXT416((uint)local_188._0_4_));
              auVar29 = vfmadd132ss_fma(auVar29,ZEXT416((uint)fVar19),ZEXT416((uint)local_158._0_4_)
                                       );
              *pfVar14 = auVar21._0_4_;
              pdVar13 = &operator[](&eigenVectors,i_01)->super_dgTemplateVector<float>;
              pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
              *pfVar14 = auVar29._0_4_;
            }
          }
        }
        else {
          uVar3 = *(uint *)((long)&local_198 + uVar18 * 4);
          auVar38._0_4_ = uVar3 ^ 0x80000000;
          auVar38._4_4_ = 0x80000000;
          auVar38._8_4_ = 0x80000000;
          auVar38._12_4_ = 0x80000000;
          uVar5 = vcmpss_avx512f(auVar38,ZEXT416(uVar3),2);
          bVar4 = (bool)((byte)uVar5 & 1);
          fVar19 = (float)(bVar4 * uVar3 + !bVar4 * auVar38._0_4_);
          if ((fVar2 + fVar19 != fVar19) || (NAN(fVar2 + fVar19) || NAN(fVar19))) goto LAB_00d9f411;
          uVar3 = *(uint *)((long)&local_198 + uVar17 * 4);
          auVar39._0_4_ = uVar3 ^ 0x80000000;
          auVar39._4_4_ = 0x80000000;
          auVar39._8_4_ = 0x80000000;
          auVar39._12_4_ = 0x80000000;
          uVar5 = vcmpss_avx512f(auVar39,ZEXT416(uVar3),2);
          bVar4 = (bool)((byte)uVar5 & 1);
          auVar24._16_48_ = auVar28;
          auVar24._0_16_ = auVar39;
          dVar22._4_60_ = auVar24._4_60_;
          dVar22.m_front.super_dgTemplateVector<float>.m_x =
               (float)(bVar4 * uVar3 + !bVar4 * auVar39._0_4_);
          if ((fVar2 + dVar22.m_front.super_dgTemplateVector<float>.m_x !=
               dVar22.m_front.super_dgTemplateVector<float>.m_x) ||
             (NAN(fVar2 + dVar22.m_front.super_dgTemplateVector<float>.m_x) ||
              NAN(dVar22.m_front.super_dgTemplateVector<float>.m_x))) goto LAB_00d9f411;
          pdVar13 = &operator[](this,i_00)->super_dgTemplateVector<float>;
          pfVar14 = dgTemplateVector<float>::operator[](pdVar13,i);
          *pfVar14 = 0.0;
        }
        uVar17 = uVar17 + 1;
        uVar15 = local_120;
      }
      uVar17 = local_128 + 1;
      uVar18 = local_140;
    }
    uVar15 = (ulong)((int)uVar15 + 1);
    local_138._0_4_ = (float)local_138._0_4_ + (float)local_178._0_8_;
    local_138._4_4_ = (float)local_138._4_4_ + SUB84(local_178._0_8_,4);
    fStack_130 = fStack_130 + 0.0;
    fStack_12c = fStack_12c + 0.0;
    local_190 = (HaF32)((float)z + local_178[2]);
    local_198 = vmovlps_avx(_local_138);
  } while( true );
}

Assistant:

void dgMatrix::EigenVectors (dgVector &eigenValues, const dgMatrix& initialGuess)
{
	hacd::HaF32 b[3];
	hacd::HaF32 z[3];
	hacd::HaF32 d[3];

	dgMatrix& mat = *this;
	dgMatrix eigenVectors (initialGuess.Transpose4X4());
	mat = initialGuess * mat * eigenVectors;

	b[0] = mat[0][0]; 
	b[1] = mat[1][1];
	b[2] = mat[2][2];

	d[0] = mat[0][0]; 
	d[1] = mat[1][1]; 
	d[2] = mat[2][2]; 

	z[0] = hacd::HaF32 (0.0f);
	z[1] = hacd::HaF32 (0.0f);
	z[2] = hacd::HaF32 (0.0f);

	for (hacd::HaI32 i = 0; i < 50; i++) {
		hacd::HaF32 sm = dgAbsf(mat[0][1]) + dgAbsf(mat[0][2]) + dgAbsf(mat[1][2]);

		if (sm < hacd::HaF32 (1.0e-6f)) {
			HACD_ASSERT (dgAbsf((eigenVectors.m_front % eigenVectors.m_front) - hacd::HaF32(1.0f)) < dgEPSILON);
			HACD_ASSERT (dgAbsf((eigenVectors.m_up % eigenVectors.m_up) - hacd::HaF32(1.0f)) < dgEPSILON);
			HACD_ASSERT (dgAbsf((eigenVectors.m_right % eigenVectors.m_right) - hacd::HaF32(1.0f)) < dgEPSILON);

			// order the eigenvalue vectors	
			dgVector tmp (eigenVectors.m_front * eigenVectors.m_up);
			if (tmp % eigenVectors.m_right < hacd::HaF32(0.0f)) {
				eigenVectors.m_right = eigenVectors.m_right.Scale (-hacd::HaF32(1.0f));
			}

			eigenValues = dgVector (d[0], d[1], d[2], hacd::HaF32 (0.0f));
			*this = eigenVectors.Inverse();
			return;
		}

		hacd::HaF32 thresh = hacd::HaF32 (0.0f);
		if (i < 3) {
			thresh = (hacd::HaF32)(0.2f / 9.0f) * sm;
		}

		for (hacd::HaI32 ip = 0; ip < 2; ip ++) {
			for (hacd::HaI32 iq = ip + 1; iq < 3; iq ++) {
				hacd::HaF32 g = hacd::HaF32 (100.0f) * dgAbsf(mat[ip][iq]);
				//if ((i > 3) && (dgAbsf(d[0]) + g == dgAbsf(d[ip])) && (dgAbsf(d[1]) + g == dgAbsf(d[1]))) {
				if ((i > 3) && ((dgAbsf(d[ip]) + g) == dgAbsf(d[ip])) && ((dgAbsf(d[iq]) + g) == dgAbsf(d[iq]))) {
					mat[ip][iq] = hacd::HaF32 (0.0f);
				} else if (dgAbsf(mat[ip][iq]) > thresh) {

					hacd::HaF32 t;
					hacd::HaF32 h = d[iq] - d[ip];
					if (dgAbsf(h) + g == dgAbsf(h)) {
						t = mat[ip][iq] / h;
					} else {
						hacd::HaF32 theta = hacd::HaF32 (0.5f) * h / mat[ip][iq];
						t = hacd::HaF32(1.0f) / (dgAbsf(theta) + dgSqrt(hacd::HaF32(1.0f) + theta * theta));
						if (theta < hacd::HaF32 (0.0f)) {
							t = -t;
						}
					}
					hacd::HaF32 c = hacd::HaF32(1.0f) / dgSqrt (hacd::HaF32 (1.0f) + t * t); 
					hacd::HaF32 s = t * c; 
					hacd::HaF32 tau = s / (hacd::HaF32(1.0f) + c); 
					h = t * mat[ip][iq];
					z[ip] -= h; 
					z[iq] += h; 
					d[ip] -= h; 
					d[iq] += h;
					mat[ip][iq] = hacd::HaF32(0.0f);

					for (hacd::HaI32 j = 0; j <= ip - 1; j ++) {
						//ROT (mat, j, ip, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[j][ip]; 
						hacd::HaF32 h = mat[j][iq]; 
						mat[j][ip] = g - s * (h + g * tau); 
						mat[j][iq] = h + s * (g - h * tau);

					}
					for (hacd::HaI32 j = ip + 1; j <= iq - 1; j ++) {
						//ROT (mat, ip, j, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[ip][j]; 
						hacd::HaF32 h = mat[j][iq]; 
						mat[ip][j] = g - s * (h + g * tau); 
						mat[j][iq] = h + s * (g - h * tau);
					}
					for (hacd::HaI32 j = iq + 1; j < 3; j ++) {
						//ROT (mat, ip, j, iq, j, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = mat[ip][j]; 
						hacd::HaF32 h = mat[iq][j]; 
						mat[ip][j] = g - s * (h + g * tau); 
						mat[iq][j] = h + s * (g - h * tau);
					}

					for (hacd::HaI32 j = 0; j < 3; j ++) {
						//ROT (eigenVectors, j, ip, j, iq, s, tau); 
						//ROT(dgMatrix &a, hacd::HaI32 i, hacd::HaI32 j, hacd::HaI32 k, hacd::HaI32 l, hacd::HaF32 s, hacd::HaF32 tau) 
						hacd::HaF32 g = eigenVectors[j][ip]; 
						hacd::HaF32 h = eigenVectors[j][iq]; 
						eigenVectors[j][ip] = g - s * (h + g * tau); 
						eigenVectors[j][iq] = h + s * (g - h * tau);
					}
				}
			}
		}
		b[0] += z[0]; d[0] = b[0]; z[0] = hacd::HaF32 (0.0f);
		b[1] += z[1]; d[1] = b[1]; z[1] = hacd::HaF32 (0.0f);
		b[2] += z[2]; d[2] = b[2]; z[2] = hacd::HaF32 (0.0f);
	}

	eigenValues = dgVector (d[0], d[1], d[2], hacd::HaF32 (0.0f));
	*this = dgGetIdentityMatrix();
}